

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::sink_it_
          (rotating_file_sink<spdlog::details::null_mutex> *this,log_msg *msg)

{
  long lVar1;
  pointer pfVar2;
  void *__buf;
  size_t sVar3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined8 in_RSI;
  size_t in_RDI;
  unsigned_long new_size;
  memory_buf_t formatted;
  allocator<char> *in_stack_fffffffffffffe88;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffe90;
  ulong local_150;
  undefined1 local_130 [16];
  file_helper *in_stack_fffffffffffffee0;
  rotating_file_sink<spdlog::details::null_mutex> *in_stack_ffffffffffffff90;
  
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pfVar2 = CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::
           operator->((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x619716);
  (*pfVar2->_vptr_formatter[2])(pfVar2,in_RSI,local_130);
  lVar1 = *(long *)(in_RDI + 0x50);
  __buf = (void *)::fmt::v11::detail::buffer<char>::size((buffer<char> *)local_130);
  local_150 = lVar1 + (long)__buf;
  __n = in_RDI;
  if (*(ulong *)(in_RDI + 0x40) < local_150) {
    details::file_helper::flush(in_stack_fffffffffffffee0);
    sVar3 = details::file_helper::size(in_stack_fffffffffffffee0);
    __buf = extraout_RDX;
    if (sVar3 != 0) {
      rotate_(in_stack_ffffffffffffff90);
      local_150 = ::fmt::v11::detail::buffer<char>::size((buffer<char> *)local_130);
      __buf = extraout_RDX_00;
    }
  }
  details::file_helper::write((file_helper *)(in_RDI + 0x58),(int)local_130,__buf,__n);
  *(ulong *)(in_RDI + 0x50) = local_150;
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x6197ff);
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    auto new_size = current_size_ + formatted.size();

    // rotate if the new estimated file size exceeds max size.
    // rotate only if the real size > 0 to better deal with full disk (see issue #2261).
    // we only check the real size when new_size > max_size_ because it is relatively expensive.
    if (new_size > max_size_) {
        file_helper_.flush();
        if (file_helper_.size() > 0) {
            rotate_();
            new_size = formatted.size();
        }
    }
    file_helper_.write(formatted);
    current_size_ = new_size;
}